

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O3

bool __thiscall
TypeFactory::setFields
          (TypeFactory *this,vector<TypeField,_std::allocator<TypeField>_> *fd,TypeStruct *ot,
          int4 fixedsize)

{
  int iVar1;
  pointer pTVar2;
  pointer pTVar3;
  long lVar4;
  LowlevelError *this_00;
  pointer pTVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  DatatypeSet *this_01;
  pair<std::_Rb_tree_iterator<Datatype_*>,_std::_Rb_tree_iterator<Datatype_*>_> pVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar2 = (fd->super__Vector_base<TypeField,_std::allocator<TypeField>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar3 = (fd->super__Vector_base<TypeField,_std::allocator<TypeField>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar2 != pTVar3) {
    uVar10 = 0;
    pTVar5 = pTVar2;
    do {
      if ((pTVar5->type->metatype == TYPE_VOID) || ((pTVar5->name)._M_string_length == 0)) {
        return false;
      }
      if ((pTVar5->offset != -1) &&
         (uVar7 = pTVar5->offset + pTVar5->type->size, (int)uVar10 < (int)uVar7)) {
        uVar10 = uVar7;
      }
      pTVar5 = pTVar5 + 1;
    } while (pTVar5 != pTVar3);
    if (pTVar2 != pTVar3) {
      uVar7 = this->align;
      pTVar5 = pTVar2;
      do {
        if (pTVar5->offset == -1) {
          uVar8 = 0;
          iVar1 = pTVar5->type->size;
          uVar9 = uVar7;
          if (1 < (int)uVar7) {
            do {
              uVar8 = uVar9;
              uVar9 = uVar8 >> 1;
            } while (iVar1 <= (int)uVar9);
            uVar8 = uVar8 - 1;
          }
          uVar9 = ((uVar10 + uVar8) - (uVar8 & uVar10)) + 1;
          if ((uVar8 & uVar10) == 0) {
            uVar9 = uVar10;
          }
          pTVar5->offset = uVar9;
          uVar10 = uVar9 + iVar1;
        }
        pTVar5 = pTVar5 + 1;
      } while (pTVar5 != pTVar3);
      if (pTVar2 != pTVar3) {
        uVar6 = ((long)pTVar3 - (long)pTVar2 >> 4) * -0x5555555555555555;
        lVar4 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<TypeField*,std::vector<TypeField,std::allocator<TypeField>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (pTVar2,pTVar3,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<TypeField*,std::vector<TypeField,std::allocator<TypeField>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pTVar2,pTVar3);
      }
    }
  }
  this_01 = &this->tree;
  local_50._M_dataplus._M_p = (pointer)ot;
  pVar11 = std::
           _Rb_tree<Datatype_*,_Datatype_*,_std::_Identity<Datatype_*>,_DatatypeCompare,_std::allocator<Datatype_*>_>
           ::equal_range(&this_01->_M_t,(key_type *)&local_50);
  std::
  _Rb_tree<Datatype_*,_Datatype_*,_std::_Identity<Datatype_*>,_DatatypeCompare,_std::allocator<Datatype_*>_>
  ::_M_erase_aux(&this_01->_M_t,(_Base_ptr)pVar11.first._M_node,(_Base_ptr)pVar11.second._M_node);
  TypeStruct::setFields(ot,fd);
  if (0 < fixedsize) {
    uVar10 = (ot->super_Datatype).size;
    if ((int)uVar10 < fixedsize) {
      (ot->super_Datatype).size = fixedsize;
    }
    else if ((uint)fixedsize < uVar10) {
      this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
      std::operator+(&local_50,"Trying to force too small a size on ",&(ot->super_Datatype).name);
      LowlevelError::LowlevelError(this_00,&local_50);
      __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
    }
  }
  local_50._M_dataplus._M_p = (pointer)ot;
  std::
  _Rb_tree<Datatype*,Datatype*,std::_Identity<Datatype*>,DatatypeCompare,std::allocator<Datatype*>>
  ::_M_insert_unique<Datatype*>
            ((_Rb_tree<Datatype*,Datatype*,std::_Identity<Datatype*>,DatatypeCompare,std::allocator<Datatype*>>
              *)this_01,(Datatype **)&local_50);
  return true;
}

Assistant:

bool TypeFactory::setFields(vector<TypeField> &fd,TypeStruct *ot,int4 fixedsize)

{
  int4 offset,cursize,curalign;

  offset = 0;
  vector<TypeField>::iterator iter;

  // Find the maximum offset, from the explicitly set offsets
  for(iter=fd.begin();iter!=fd.end();++iter) {
    Datatype *ct = (*iter).type;
    // Do some sanity checks on the field
    if (ct->getMetatype() == TYPE_VOID) return false;
    if ((*iter).name.size() == 0) return false;

    if ((*iter).offset != -1) {
      int4 end = (*iter).offset + ct->getSize();
      if (end > offset)
	offset = end;
    }
  }

  // Assign offsets, respecting alignment, where not explicitly set
  for(iter=fd.begin();iter!=fd.end();++iter) {
    if ((*iter).offset != -1) continue;
    cursize = (*iter).type->getSize();
    curalign = 0;
    if (align > 1) {
      curalign = align;
      while((curalign>>1) >= cursize)
	curalign >>= 1;
      curalign -= 1;
    }
    if ((offset & curalign)!=0)
      offset = (offset-(offset & curalign) + (curalign+1));
    (*iter).offset = offset;
    offset += cursize;
  }

  sort(fd.begin(),fd.end());	// Sort fields by offset

  // We could check field overlapping here

  tree.erase(ot);
  ot->setFields(fd);
  if (fixedsize > 0) {		// If the caller is trying to force a size
    if (fixedsize > ot->size)	// If the forced size is bigger than the size required for fields
      ot->size = fixedsize;	//     Force the bigger size
    else if (fixedsize < ot->size) // If the forced size is smaller, this is an error
      throw LowlevelError("Trying to force too small a size on "+ot->getName());
  }
  tree.insert(ot);
  return true;
}